

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<(anonymous_namespace)::ObjectStruct> * __thiscall
cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::
Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::ObjectStruct> *this,string_view *name,
          offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<(anonymous_namespace)::ObjectStruct> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *pfStack_28;
  bool required_local;
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *func_local;
  offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  member_local;
  string_view *name_local;
  Object<(anonymous_namespace)::ObjectStruct> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                *)member;
  member_local = (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  )name;
  name_local = (string_view *)this;
  std::
  function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_78.func,func);
  local_78.member =
       (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)
       func_local;
  std::
  function<(anonymous_namespace)::ErrorCode((anonymous_namespace)::ObjectStruct&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>::Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string(anonymous_namespace)::ObjectStruct::*,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,bool)::_lambda((anonymous_namespace)::ObjectStruct&,Json::Value_const*)_1_,void>
            ((function<(anonymous_namespace)::ErrorCode((anonymous_namespace)::ObjectStruct&,Json::Value_const*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*)>
  ::~function(&local_50);
  Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string(anonymous_namespace)::ObjectStruct::*,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>,bool)
  ::{lambda((anonymous_namespace)::ObjectStruct&,Json::Value_const*)#1}::~basic_string_view
            ((_lambda__anonymous_namespace___ObjectStruct__Json__Value_const___1_ *)&local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }